

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDF_ERROR_CODE
qpdf_read_memory(qpdf_data qpdf,char *description,char *buffer,unsigned_long_long size,
                char *password)

{
  QPDF_ERROR_CODE QVar1;
  function<void_(_qpdf_data_*)> local_28;
  
  qpdf->filename = description;
  qpdf->buffer = buffer;
  qpdf->size = size;
  qpdf->password = password;
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = call_read_memory;
  local_28._M_invoker =
       std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_manager;
  QVar1 = trap_errors(qpdf,&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_read_memory(
    qpdf_data qpdf,
    char const* description,
    char const* buffer,
    unsigned long long size,
    char const* password)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = description;
    qpdf->buffer = buffer;
    qpdf->size = size;
    qpdf->password = password;
    status = trap_errors(qpdf, &call_read_memory);
    QTC::TC("qpdf", "qpdf-c called qpdf_read_memory", status);
    return status;
}